

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  VkAllocationCallbacks **this;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  allocator<char> local_f1;
  string local_f0;
  Move<vk::Handle<(vk::HandleType)14>_> local_c0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_a0;
  undefined1 local_80 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> obj;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  Environment::Environment((Environment *)&res,context,1);
  this = &obj.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  ShaderModule::Resources::Resources((Resources *)this,(Environment *)&res,params);
  ShaderModule::create(&local_c0,(Environment *)&res,(Resources *)this,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
  data.deleter.m_deviceIface = local_a0.deleter.m_deviceIface;
  data.object.m_internal = local_a0.object.m_internal;
  data.deleter.m_device = local_a0.deleter.m_device;
  data.deleter.m_allocator = local_a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_80,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Ok",&local_f1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}